

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O0

void __thiscall
glslang::TParseVersions::requireInt16Arithmetic
          (TParseVersions *this,TSourceLoc *loc,char *op,char *featureDesc)

{
  char *pcVar1;
  char *local_68;
  char *extensions [3];
  TString combined;
  char *featureDesc_local;
  char *op_local;
  TSourceLoc *loc_local;
  TParseVersions *this_local;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               (extensions + 2));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
            (extensions + 2),op);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             (extensions + 2),": ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             (extensions + 2),featureDesc);
  local_68 = "GL_AMD_gpu_shader_int16";
  extensions[0] = "GL_EXT_shader_explicit_arithmetic_types";
  extensions[1] = "GL_EXT_shader_explicit_arithmetic_types_int16";
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   (extensions + 2));
  (*this->_vptr_TParseVersions[5])(this,loc,3,&local_68,pcVar1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (extensions + 2));
  return;
}

Assistant:

void TParseVersions::requireInt16Arithmetic(const TSourceLoc& loc, const char* op, const char* featureDesc)
{
    TString combined;
    combined = op;
    combined += ": ";
    combined += featureDesc;

    const char* const extensions[] = {
                                       E_GL_AMD_gpu_shader_int16,
                                       E_GL_EXT_shader_explicit_arithmetic_types,
                                       E_GL_EXT_shader_explicit_arithmetic_types_int16};
    requireExtensions(loc, sizeof(extensions)/sizeof(extensions[0]), extensions, combined.c_str());
}